

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TensorExprTree.h
# Opt level: O2

string * __thiscall
phaeton::IdentifierExpr::getName_abi_cxx11_(string *__return_storage_ptr__,IdentifierExpr *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Name);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getName() const override { return Name; }